

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void pcut_failed_assertion(char *message)

{
  char *teardown_error_message;
  
  if (print_test_error == '\x01') {
    pcut_print_fail_message(message);
  }
  if (execute_teardown_on_failure == '\x01') {
    execute_teardown_on_failure = '\0';
    pcut_failed_assertion::prev_message = message;
    if (current_suite->teardown_func != (pcut_setup_func_t)0x0) {
      (*current_suite->teardown_func)();
    }
    if (report_test_result != '\x01') goto LAB_00102059;
    teardown_error_message = (char *)0x0;
  }
  else {
    teardown_error_message = message;
    message = pcut_failed_assertion::prev_message;
    if (report_test_result != '\x01') goto LAB_00102059;
  }
  pcut_report_test_done(current_test,1,message,teardown_error_message,(char *)0x0);
LAB_00102059:
  pcut_failed_assertion::prev_message = (char *)0x0;
  if (leave_means_exit != '\x01') {
    longjmp((__jmp_buf_tag *)start_test_jump,1);
  }
  exit(1);
}

Assistant:

void pcut_failed_assertion(const char *message) {
	static const char *prev_message = NULL;
	/*
	 * The assertion failed. We need to abort the current test,
	 * inform the user and perform some clean-up. That could
	 * include running the tear-down routine.
	 */
	if (print_test_error) {
		pcut_print_fail_message(message);
	}

	if (execute_teardown_on_failure) {
		execute_teardown_on_failure = 0;
		prev_message = message;
		run_setup_teardown(current_suite->teardown_func);

		/* Tear-down was okay. */
		if (report_test_result) {
			pcut_report_test_done(current_test, PCUT_OUTCOME_FAIL,
				message, NULL, NULL);
		}
	} else {
		if (report_test_result) {
			pcut_report_test_done(current_test, PCUT_OUTCOME_FAIL,
				prev_message, message, NULL);
		}
	}

	prev_message = NULL;

	leave_test(PCUT_OUTCOME_FAIL); /* No return. */
}